

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerGLSL::emit_block_instructions(CompilerGLSL *this,SPIRBlock *block)

{
  uint32_t uVar1;
  iterator iVar2;
  long lVar3;
  Instruction *instruction;
  Phi *pPVar4;
  TemporaryCopy temporary_copy;
  TemporaryCopy local_a0;
  uint32_t local_94;
  SPIRBlock *local_90;
  uint32_t local_88 [4];
  SmallVector<unsigned_int,_8UL> local_78;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_40;
  uint *local_38;
  
  this->current_emitting_block = block;
  local_90 = block;
  if ((this->backend).requires_relaxed_precision_analysis == true) {
    pPVar4 = (block->phi_variables).super_VectorView<spirv_cross::SPIRBlock::Phi>.ptr;
    local_40 = &(this->temporary_to_mirror_precision_alias)._M_h;
    for (lVar3 = (block->phi_variables).super_VectorView<spirv_cross::SPIRBlock::Phi>.buffer_size *
                 0xc; lVar3 != 0; lVar3 = lVar3 + -0xc) {
      local_88[0] = (pPVar4->function_variable).id;
      iVar2 = ::std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(local_40,local_88);
      if (iVar2.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur
          != (__node_type *)0x0) {
        local_78.super_VectorView<unsigned_int>.buffer_size = 0;
        local_78.super_VectorView<unsigned_int>.ptr = (uint *)&local_78.stack_storage;
        local_78.buffer_capacity = 8;
        local_88[0] = 0x53;
        local_88[1] = 0;
        local_88[2] = 3;
        uVar1 = Compiler::expression_type_id
                          (&this->super_Compiler,
                           *(uint32_t *)
                            ((long)iVar2.
                                   super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                   ._M_cur + 8));
        local_38 = (uint *)((long)iVar2.
                                  super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                  ._M_cur + 8);
        local_a0.dst_id = uVar1;
        SmallVector<unsigned_int,_8UL>::push_back(&local_78,&local_a0.dst_id);
        SmallVector<unsigned_int,_8UL>::push_back
                  (&local_78,
                   (uint *)((long)iVar2.
                                  super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                  ._M_cur + 0xc));
        SmallVector<unsigned_int,_8UL>::push_back(&local_78,local_38);
        (*(this->super_Compiler)._vptr_Compiler[8])(this,local_88);
        SmallVector<unsigned_int,_8UL>::~SmallVector(&local_78);
      }
      pPVar4 = pPVar4 + 1;
    }
  }
  instruction = (local_90->ops).super_VectorView<spirv_cross::Instruction>.ptr;
  for (lVar3 = (local_90->ops).super_VectorView<spirv_cross::Instruction>.buffer_size * 0xc;
      lVar3 != 0; lVar3 = lVar3 + -0xc) {
    local_a0 = handle_instruction_precision(this,instruction);
    (*(this->super_Compiler)._vptr_Compiler[8])(this,instruction);
    if (local_a0.dst_id != 0) {
      local_78.super_VectorView<unsigned_int>.buffer_size = 0;
      local_78.super_VectorView<unsigned_int>.ptr = (uint *)&local_78.stack_storage;
      local_78.buffer_capacity = 8;
      local_88[0] = 0x53;
      local_88[1] = 0;
      local_88[2] = 3;
      local_94 = Compiler::expression_type_id(&this->super_Compiler,local_a0.src_id);
      SmallVector<unsigned_int,_8UL>::push_back(&local_78,&local_94);
      SmallVector<unsigned_int,_8UL>::push_back(&local_78,&local_a0.dst_id);
      SmallVector<unsigned_int,_8UL>::push_back(&local_78,&local_a0.src_id);
      this->block_temporary_hoisting = true;
      (*(this->super_Compiler)._vptr_Compiler[8])(this,local_88);
      this->block_temporary_hoisting = false;
      SmallVector<unsigned_int,_8UL>::~SmallVector(&local_78);
    }
    instruction = instruction + 1;
  }
  this->current_emitting_block = (SPIRBlock *)0x0;
  return;
}

Assistant:

void CompilerGLSL::emit_block_instructions(SPIRBlock &block)
{
	current_emitting_block = &block;

	if (backend.requires_relaxed_precision_analysis)
	{
		// If PHI variables are consumed in unexpected precision contexts, copy them here.
		for (auto &phi : block.phi_variables)
		{
			auto itr = temporary_to_mirror_precision_alias.find(phi.function_variable);
			if (itr != temporary_to_mirror_precision_alias.end())
			{
				// Explicitly, we don't want to inherit RelaxedPrecision state in this CopyObject,
				// so it helps to have handle_instruction_precision() on the outside of emit_instruction().
				EmbeddedInstruction inst;
				inst.op = OpCopyObject;
				inst.length = 3;
				inst.ops.push_back(expression_type_id(itr->first));
				inst.ops.push_back(itr->second);
				inst.ops.push_back(itr->first);
				emit_instruction(inst);
			}
		}
	}

	for (auto &op : block.ops)
	{
		auto temporary_copy = handle_instruction_precision(op);
		emit_instruction(op);
		if (temporary_copy.dst_id)
		{
			// Explicitly, we don't want to inherit RelaxedPrecision state in this CopyObject,
			// so it helps to have handle_instruction_precision() on the outside of emit_instruction().
			EmbeddedInstruction inst;
			inst.op = OpCopyObject;
			inst.length = 3;
			inst.ops.push_back(expression_type_id(temporary_copy.src_id));
			inst.ops.push_back(temporary_copy.dst_id);
			inst.ops.push_back(temporary_copy.src_id);

			// Never attempt to hoist mirrored temporaries.
			// They are hoisted in lock-step with their parents.
			block_temporary_hoisting = true;
			emit_instruction(inst);
			block_temporary_hoisting = false;
		}
	}

	current_emitting_block = nullptr;
}